

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

optional<metaf::Temperature> metaf::Temperature::fromRemarkString(string *s)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  optional<metaf::Temperature> oVar11;
  
  if (s->_M_string_length == 4) {
    pbVar4 = (byte *)(s->_M_dataplus)._M_p;
    bVar2 = *pbVar4;
    iVar7 = 0;
    if ((bVar2 & 0xfe) == 0x30) {
      lVar9 = 1;
      do {
        bVar3 = pbVar4[lVar9];
        bVar1 = bVar3 - 0x3a;
        if (bVar1 < 0xf6) {
          iVar7 = 0;
          break;
        }
        iVar7 = (uint)(byte)(bVar3 - 0x30) + iVar7 * 10;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 4);
      if (0xf5 < bVar1) {
        iVar6 = -iVar7;
        if (bVar2 != 0x31) {
          iVar6 = iVar7;
        }
        uVar8 = 0x100000000;
        dVar10 = round((double)((float)iVar6 / 10.0) * 10.0);
        uVar5 = (ulong)(uint)(int)dVar10;
        lVar9 = (ulong)((float)iVar6 / 10.0 < 0.0) + 0x100000100;
        goto LAB_001abbf7;
      }
    }
  }
  lVar9 = 0;
  uVar5 = 0;
  uVar8 = 0;
LAB_001abbf7:
  oVar11.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Temperature>._M_payload._0_8_ = uVar5 | uVar8;
  oVar11.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Temperature>._8_8_ = lVar9;
  return (optional<metaf::Temperature>)
         oVar11.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Temperature>;
}

Assistant:

std::optional<Temperature> Temperature::fromRemarkString(const std::string & s) {
	//static const std::regex ("([01])(\\d\\d\\d)");
	std::optional<Temperature> error;
	if (s.length() != 4) return error;
	if (s[0] != '0' && s[0] != '1') return error;
	const auto t = strToUint(s, 1, 3);
	if (!t.has_value()) return error;
	int tValueSigned = int(*t);
	if (s[0] == '1') tValueSigned = -tValueSigned;
	return Temperature(tValueSigned / 10.0f);
}